

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ApplyWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  ImVec2 IVar4;
  ImGuiViewport *pIVar5;
  float fVar6;
  float fVar7;
  
  pIVar5 = ImGui::GetMainViewport();
  window->ViewportPos = pIVar5->Pos;
  if (settings->ViewportId != 0) {
    window->ViewportId = settings->ViewportId;
    sVar1 = (settings->ViewportPos).y;
    (window->ViewportPos).x = (float)(int)(settings->ViewportPos).x;
    (window->ViewportPos).y = (float)(int)sVar1;
  }
  IVar4.y = (float)(int)((float)(int)(settings->Pos).y + (window->ViewportPos).y);
  IVar4.x = (float)(int)((float)(int)(settings->Pos).x + (window->ViewportPos).x);
  window->Pos = IVar4;
  uVar2 = (settings->Size).x;
  if ((0 < (short)uVar2) && (uVar3 = (settings->Size).y, 0 < (short)uVar3)) {
    fVar6 = (float)uVar2;
    fVar7 = (float)uVar3;
    (window->Size).x = fVar6;
    (window->Size).y = fVar7;
    (window->SizeFull).x = fVar6;
    (window->SizeFull).y = fVar7;
  }
  window->Collapsed = settings->Collapsed;
  window->DockId = settings->DockId;
  window->DockOrder = settings->DockOrder;
  return;
}

Assistant:

static void ApplyWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->ViewportPos = main_viewport->Pos;
    if (settings->ViewportId)
    {
        window->ViewportId = settings->ViewportId;
        window->ViewportPos = ImVec2(settings->ViewportPos.x, settings->ViewportPos.y);
    }
    window->Pos = ImFloor(ImVec2(settings->Pos.x + window->ViewportPos.x, settings->Pos.y + window->ViewportPos.y));
    if (settings->Size.x > 0 && settings->Size.y > 0)
        window->Size = window->SizeFull = ImFloor(ImVec2(settings->Size.x, settings->Size.y));
    window->Collapsed = settings->Collapsed;
    window->DockId = settings->DockId;
    window->DockOrder = settings->DockOrder;
}